

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O2

CMimeHeader_T * cmime_header_new(void)

{
  CMimeHeader_T *pCVar1;
  
  pCVar1 = (CMimeHeader_T *)calloc(1,0x20);
  return pCVar1;
}

Assistant:

CMimeHeader_T *cmime_header_new(void) {
    CMimeHeader_T *h;
    h = (CMimeHeader_T *)calloc((size_t)1,sizeof(CMimeHeader_T));
    h->count = 0;
    h->name =  NULL;
    h->value = NULL;
    return(h);
}